

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void __thiscall ExampleAppConsole::~ExampleAppConsole(ExampleAppConsole *this)

{
  char **ppcVar1;
  long in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int i_00;
  
  ClearLog((ExampleAppConsole *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  for (i_00 = 0; i_00 < *(int *)(in_RDI + 0x120); i_00 = i_00 + 1) {
    ppcVar1 = ImVector<char_*>::operator[]((ImVector<char_*> *)(in_RDI + 0x120),i_00);
    free(*ppcVar1);
  }
  ImGuiTextFilter::~ImGuiTextFilter((ImGuiTextFilter *)0x184a8a);
  ImVector<char_*>::~ImVector((ImVector<char_*> *)CONCAT44(i_00,in_stack_fffffffffffffff0));
  ImVector<const_char_*>::~ImVector
            ((ImVector<const_char_*> *)CONCAT44(i_00,in_stack_fffffffffffffff0));
  ImVector<char_*>::~ImVector((ImVector<char_*> *)CONCAT44(i_00,in_stack_fffffffffffffff0));
  return;
}

Assistant:

~ExampleAppConsole()
    {
        ClearLog();
        for (int i = 0; i < History.Size; i++)
            free(History[i]);
    }